

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::anon_unknown_23::PosixColourImpl::use(PosixColourImpl *this,Code _colourCode)

{
  undefined4 in_register_00000034;
  char *this_00;
  ReusableStringStream RStack_48;
  string local_38;
  SourceLineInfo local_18;
  
  switch(_colourCode) {
  case None:
  case Headers:
    this_00 = "[0m";
    break;
  case Red:
    this_00 = "[0;31m";
    break;
  case Green:
    this_00 = "[0;32m";
    break;
  case Blue:
    this_00 = "[0;34m";
    break;
  case Cyan:
    this_00 = "[0;36m";
    break;
  case Yellow:
    this_00 = "[0;33m";
    break;
  case Grey:
    this_00 = "[1;30m";
    break;
  default:
    ReusableStringStream::ReusableStringStream(&RStack_48);
    local_18.file =
         "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp"
    ;
    local_18.line = 0xca1;
    operator<<(RStack_48.m_oss,&local_18);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_48.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_48.m_oss,"Unknown colour requested",0x18);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_38);
  case Bright:
    ReusableStringStream::ReusableStringStream(&RStack_48);
    local_18.file =
         "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp"
    ;
    local_18.line = 0xca0;
    operator<<(RStack_48.m_oss,&local_18);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_48.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(RStack_48.m_oss,"not a colour",0xc);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_38);
  case BrightWhite:
    this_00 = "[1;37m";
    break;
  case BrightRed:
    this_00 = "[1;31m";
    break;
  case BrightGreen:
    this_00 = "[1;32m";
    break;
  case BrightYellow:
    this_00 = "[1;33m";
    break;
  case FileName:
    this_00 = "[0;37m";
  }
  setColour((PosixColourImpl *)this_00,(char *)CONCAT44(in_register_00000034,_colourCode));
  return;
}

Assistant:

void use(Colour::Code _colourCode) override {
                switch (_colourCode) {
                case Colour::None:
                case Colour::White:     return setColour("[0m");
                case Colour::Red:       return setColour("[0;31m");
                case Colour::Green:     return setColour("[0;32m");
                case Colour::Blue:      return setColour("[0;34m");
                case Colour::Cyan:      return setColour("[0;36m");
                case Colour::Yellow:    return setColour("[0;33m");
                case Colour::Grey:      return setColour("[1;30m");

                case Colour::LightGrey:     return setColour("[0;37m");
                case Colour::BrightRed:     return setColour("[1;31m");
                case Colour::BrightGreen:   return setColour("[1;32m");
                case Colour::BrightWhite:   return setColour("[1;37m");
                case Colour::BrightYellow:  return setColour("[1;33m");

                case Colour::Bright: CATCH_INTERNAL_ERROR("not a colour");
                default: CATCH_INTERNAL_ERROR("Unknown colour requested");
                }
            }